

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

void ggml_gallocr_alloc_graph_impl
               (ggml_gallocr_t galloc,ggml_cgraph *graph,int *node_buffer_ids,int *leaf_buffer_ids)

{
  ggml_tensor *t;
  ggml_tensor *pgVar1;
  long lVar2;
  _Bool _Var3;
  hash_node *phVar4;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  ggml_gallocr_t in_RDI;
  hash_node *view_src_hn;
  ggml_tensor *view_src_1;
  hash_node *p_hn;
  ggml_tensor *parent_2;
  int j_3;
  ggml_tensor *parent_1;
  int j_2;
  ggml_tensor *parent;
  int j_1;
  int buffer_id;
  ggml_tensor *node_1;
  int i_2;
  ggml_tensor *src;
  int j;
  ggml_tensor *view_src;
  ggml_tensor *node;
  int i_1;
  ggml_tensor *leaf;
  int i;
  ggml_tensor *in_stack_ffffffffffffff18;
  ggml_gallocr_t in_stack_ffffffffffffff20;
  ggml_tensor *in_stack_ffffffffffffff48;
  ggml_gallocr_t in_stack_ffffffffffffff50;
  hash_node *in_stack_ffffffffffffff60;
  int buffer_id_00;
  ggml_tensor *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_7c;
  int local_70;
  int local_5c;
  int local_4c;
  int local_34;
  int local_24;
  
  ggml_hash_set_reset((ggml_hash_set *)in_stack_ffffffffffffff20);
  memset(in_RDI->hash_values,0,(in_RDI->hash_set).size << 5);
  for (local_24 = 0; local_24 < *(int *)(in_RSI + 8); local_24 = local_24 + 1) {
    in_stack_ffffffffffffff48 = *(ggml_tensor **)(*(long *)(in_RSI + 0x28) + (long)local_24 * 8);
    get_node_buffer_id(in_RCX,local_24);
    ggml_gallocr_allocate_node
              ((ggml_gallocr_t)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  }
  for (local_34 = 0; local_34 < *(int *)(in_RSI + 4); local_34 = local_34 + 1) {
    t = *(ggml_tensor **)(*(long *)(in_RSI + 0x10) + (long)local_34 * 8);
    _Var3 = ggml_is_view(t);
    if ((_Var3) && (t->op != GGML_OP_NONE)) {
      phVar4 = ggml_gallocr_hash_get(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      phVar4->n_views = phVar4->n_views + 1;
    }
    if ((t->flags & 1U) != 0) {
      get_node_buffer_id(in_RDX,local_34);
      ggml_gallocr_allocate_node
                ((ggml_gallocr_t)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    for (local_4c = 0; local_4c < 10; local_4c = local_4c + 1) {
      pgVar1 = t->src[local_4c];
      if (pgVar1 != (ggml_tensor *)0x0) {
        phVar4 = ggml_gallocr_hash_get(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        phVar4->n_children = phVar4->n_children + 1;
        if ((pgVar1->flags & 1U) != 0) {
          in_stack_ffffffffffffff20 = in_RDI;
          get_node_buffer_id(in_RDX,local_34);
          ggml_gallocr_allocate_node
                    ((ggml_gallocr_t)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        }
      }
    }
  }
  for (local_5c = 0; local_5c < *(int *)(in_RSI + 4); local_5c = local_5c + 1) {
    lVar2 = *(long *)(*(long *)(in_RSI + 0x10) + (long)local_5c * 8);
    get_node_buffer_id(in_RDX,local_5c);
    for (local_70 = 0; buffer_id_00 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20), local_70 < 10
        ; local_70 = local_70 + 1) {
      if (*(long *)(lVar2 + 0x98 + (long)local_70 * 8) != 0) {
        ggml_gallocr_allocate_node
                  ((ggml_gallocr_t)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,buffer_id_00);
      }
    }
    ggml_gallocr_allocate_node
              ((ggml_gallocr_t)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,buffer_id_00);
    for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
    }
    for (in_stack_ffffffffffffff74 = 0; in_stack_ffffffffffffff74 < 10;
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
      in_stack_ffffffffffffff68 =
           *(ggml_tensor **)(lVar2 + 0x98 + (long)in_stack_ffffffffffffff74 * 8);
      if (in_stack_ffffffffffffff68 != (ggml_tensor *)0x0) {
        in_stack_ffffffffffffff60 =
             ggml_gallocr_hash_get(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff60->n_children = in_stack_ffffffffffffff60->n_children + -1;
        if ((in_stack_ffffffffffffff60->n_children == 0) &&
           (in_stack_ffffffffffffff60->n_views == 0)) {
          _Var3 = ggml_is_view(in_stack_ffffffffffffff68);
          if (_Var3) {
            in_stack_ffffffffffffff50 =
                 (ggml_gallocr_t)
                 ggml_gallocr_hash_get(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            *(int *)((long)&in_stack_ffffffffffffff50->bufts + 4) =
                 *(int *)((long)&in_stack_ffffffffffffff50->bufts + 4) + -1;
            if (((*(int *)((long)&in_stack_ffffffffffffff50->bufts + 4) == 0) &&
                (*(int *)&in_stack_ffffffffffffff50->bufts == 0)) &&
               ((in_stack_ffffffffffffff50->n_buffers & 1) != 0)) {
              ggml_gallocr_free_node(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            }
          }
          else if ((in_stack_ffffffffffffff60->allocated & 1U) != 0) {
            ggml_gallocr_free_node(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ggml_gallocr_alloc_graph_impl(ggml_gallocr_t galloc, struct ggml_cgraph * graph, const int * node_buffer_ids, const int * leaf_buffer_ids) {
    // clear hash tables
    ggml_hash_set_reset(&galloc->hash_set);
    memset(galloc->hash_values, 0, sizeof(struct hash_node) * galloc->hash_set.size);

    // allocate leafs
    // these may be tensors that the application is not using in the graph, but may still want to allocate for other purposes
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        ggml_gallocr_allocate_node(galloc, leaf, get_node_buffer_id(leaf_buffer_ids, i));
    }

    // count number of children and views
    // allocate other graph inputs and leafs first to avoid overwriting them
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];

        // TODO: better way to add external dependencies
        // GGML_OP_NONE does not appear normally in the graph nodes, but is used by ggml-backend to add dependencies to
        // control when some tensors are allocated and freed. in this case, the dependencies are in `src`, but the node
        // itself is never used and should not be considered a dependency
        if (ggml_is_view(node) && node->op != GGML_OP_NONE) {
            struct ggml_tensor * view_src = node->view_src;
            ggml_gallocr_hash_get(galloc, view_src)->n_views += 1;
        }

        if (node->flags & GGML_TENSOR_FLAG_INPUT) {
            ggml_gallocr_allocate_node(galloc, graph->nodes[i], get_node_buffer_id(node_buffer_ids, i));
        }

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }

            ggml_gallocr_hash_get(galloc, src)->n_children += 1;

            // allocate explicit inputs
            if (src->flags & GGML_TENSOR_FLAG_INPUT) {
                ggml_gallocr_allocate_node(galloc, src, get_node_buffer_id(node_buffer_ids, i));
            }
        }
    }

    // allocate tensors
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int buffer_id = get_node_buffer_id(node_buffer_ids, i);

        // allocate parents (only leafs need to be allocated at this point)
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * parent = node->src[j];
            if (parent == NULL) {
                continue;
            }
            ggml_gallocr_allocate_node(galloc, parent, buffer_id);
        }

        // allocate node
        ggml_gallocr_allocate_node(galloc, node, buffer_id);

        AT_PRINTF("exec: %s (%s) <= ", ggml_op_desc(node), node->name);
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * parent = node->src[j];
            if (parent == NULL) {
                continue;
            }
            AT_PRINTF("%s", parent->name);
            if (j < GGML_MAX_SRC - 1 && node->src[j + 1] != NULL) {
                AT_PRINTF(", ");
            }
        }
        AT_PRINTF("\n");

        // update parents
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * parent = node->src[j];
            if (parent == NULL) {
                continue;
            }
            struct hash_node * p_hn = ggml_gallocr_hash_get(galloc, parent);
            p_hn->n_children -= 1;

            AT_PRINTF("parent %s: %d children, %d views, allocated: %d\n",
                parent->name, p_hn->n_children, p_hn->n_views, p_hn->allocated);

            if (p_hn->n_children == 0 && p_hn->n_views == 0) {
                if (ggml_is_view(parent)) {
                    struct ggml_tensor * view_src = parent->view_src;
                    struct hash_node * view_src_hn = ggml_gallocr_hash_get(galloc, view_src);
                    view_src_hn->n_views -= 1;
                    AT_PRINTF("view_src %s: %d children, %d views\n",
                        view_src->name, view_src_hn->n_children, view_src_hn->n_views);
                    if (view_src_hn->n_views == 0 && view_src_hn->n_children == 0 && view_src_hn->allocated) {
                        ggml_gallocr_free_node(galloc, view_src);
                    }
                }
                else if (p_hn->allocated) {
                    ggml_gallocr_free_node(galloc, parent);
                }
            }
            AT_PRINTF("\n");
        }
    }
}